

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_table_get_ge(secp256k1_ge *r,secp256k1_ge *pre,int n,int w)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  
  secp256k1_ecmult_table_verify(in_EDX,in_ECX);
  if (in_EDX < 1) {
    memcpy(in_RDI,(void *)(in_RSI + (long)((-1 - in_EDX) / 2) * 0x58),0x58);
    secp256k1_fe_impl_negate_unchecked
              ((secp256k1_fe *)((long)in_RDI + 0x28),(secp256k1_fe *)((long)in_RDI + 0x28),1);
  }
  else {
    memcpy(in_RDI,(void *)(in_RSI + (long)((in_EDX + -1) / 2) * 0x58),0x58);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge(secp256k1_ge *r, const secp256k1_ge *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        *r = pre[(n-1)/2];
    } else {
        *r = pre[(-n-1)/2];
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}